

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

void convert_channels_short_interleaved
               (int buf_c,short *buffer,int data_c,float **data,int d_offset,int len)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int o;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  float fVar14;
  float local_b8 [34];
  
  if (((data_c < 7) && (buf_c < 3)) && (buf_c != data_c)) {
    uVar5 = (ulong)(uint)data_c;
    if (data_c < 1) {
      uVar5 = 0;
    }
    uVar4 = (ulong)(uint)buf_c;
    if (buf_c < 1) {
      uVar4 = 0;
    }
    for (iVar2 = 0; iVar2 != (int)uVar4; iVar2 = iVar2 + 1) {
      iVar7 = 0;
      iVar12 = 0;
      iVar8 = 0x10;
      lVar11 = (long)d_offset << 2;
      for (lVar10 = 0; lVar10 < len; lVar10 = lVar10 + 0x10) {
        local_b8[0x1c] = 0.0;
        local_b8[0x1d] = 0.0;
        local_b8[0x1e] = 0.0;
        local_b8[0x1f] = 0.0;
        local_b8[0x18] = 0.0;
        local_b8[0x19] = 0.0;
        local_b8[0x1a] = 0.0;
        local_b8[0x1b] = 0.0;
        local_b8[0x14] = 0.0;
        local_b8[0x15] = 0.0;
        local_b8[0x16] = 0.0;
        local_b8[0x17] = 0.0;
        local_b8[0x10] = 0.0;
        local_b8[0x11] = 0.0;
        local_b8[0x12] = 0.0;
        local_b8[0x13] = 0.0;
        local_b8[0xc] = 0.0;
        local_b8[0xd] = 0.0;
        local_b8[0xe] = 0.0;
        local_b8[0xf] = 0.0;
        local_b8[8] = 0.0;
        local_b8[9] = 0.0;
        local_b8[10] = 0.0;
        local_b8[0xb] = 0.0;
        local_b8[4] = 0.0;
        local_b8[5] = 0.0;
        local_b8[6] = 0.0;
        local_b8[7] = 0.0;
        local_b8[0] = 0.0;
        local_b8[1] = 0.0;
        local_b8[2] = 0.0;
        local_b8[3] = 0.0;
        iVar6 = iVar8 + (int)lVar10;
        iVar1 = iVar6;
        if (len < iVar6) {
          iVar1 = len;
          iVar8 = len - (int)lVar10;
        }
        uVar3 = (ulong)(uint)(iVar1 + iVar12);
        if (iVar1 + iVar12 < 1) {
          uVar3 = 0;
        }
        for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
          switch(channel_position[data_c][uVar9] & 6) {
          case 2:
            for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
              local_b8[uVar13 * 2] =
                   *(float *)((long)data[uVar9] + uVar13 * 4 + lVar11) + local_b8[uVar13 * 2];
            }
            break;
          case 4:
            for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
              local_b8[uVar13 * 2 + 1] =
                   *(float *)((long)data[uVar9] + uVar13 * 4 + lVar11) + local_b8[uVar13 * 2 + 1];
            }
            break;
          case 6:
            for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
              fVar14 = *(float *)((long)data[uVar9] + uVar13 * 4 + lVar11);
              *(ulong *)(local_b8 + uVar13 * 2) =
                   CONCAT44(fVar14 + (float)((ulong)*(undefined8 *)(local_b8 + uVar13 * 2) >> 0x20),
                            fVar14 + (float)*(undefined8 *)(local_b8 + uVar13 * 2));
            }
          }
        }
        if (len < iVar6) {
          iVar6 = len;
        }
        iVar1 = (iVar6 + iVar12) * 2;
        if (iVar1 < 1) {
          iVar1 = 0;
        }
        for (uVar3 = 0; (uint)(iVar1 * 2) != uVar3; uVar3 = uVar3 + 2) {
          fVar14 = *(float *)((long)local_b8 + uVar3 * 2) + 384.0;
          if ((int)fVar14 < 0x43bf8001) {
            fVar14 = 383.0;
          }
          if (0x43c07ffe < (int)fVar14) {
            fVar14 = 384.99997;
          }
          *(short *)((long)buffer + uVar3 + (long)iVar7 * 2) = SUB42(fVar14,0);
        }
        iVar12 = iVar12 + -0x10;
        lVar11 = lVar11 + 0x40;
        iVar7 = iVar7 + 0x20;
      }
    }
  }
  else {
    if (buf_c < data_c) {
      data_c = buf_c;
    }
    uVar4 = 0;
    uVar5 = (ulong)(uint)data_c;
    if (data_c < 1) {
      uVar5 = uVar4;
    }
    uVar3 = (ulong)(uint)len;
    if (len < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      for (uVar9 = 0; (uint)((int)uVar5 * 2) != uVar9; uVar9 = uVar9 + 2) {
        fVar14 = *(float *)(*(long *)((long)data + uVar9 * 4) + uVar4 * 4 + (long)d_offset * 4) +
                 384.0;
        if ((int)fVar14 < 0x43bf8001) {
          fVar14 = 383.0;
        }
        if (0x43c07ffe < (int)fVar14) {
          fVar14 = 384.99997;
        }
        *(short *)((long)buffer + uVar9) = SUB42(fVar14,0);
      }
      buffer = (short *)((long)buffer + uVar9);
      for (uVar9 = uVar5; (int)uVar9 < buf_c; uVar9 = (ulong)((int)uVar9 + 1)) {
        *buffer = 0;
        buffer = buffer + 1;
      }
    }
  }
  return;
}

Assistant:

static void convert_channels_short_interleaved(int buf_c, short *buffer, int data_c, float **data, int d_offset, int len)
{
   int i;
   check_endianness();
   if (buf_c != data_c && buf_c <= 2 && data_c <= 6) {
      assert(buf_c == 2);
      for (i=0; i < buf_c; ++i)
         compute_stereo_samples(buffer, data_c, data, d_offset, len);
   } else {
      int limit = buf_c < data_c ? buf_c : data_c;
      int j;
      for (j=0; j < len; ++j) {
         for (i=0; i < limit; ++i) {
            FASTDEF(temp);
            float f = data[i][d_offset+j];
            int v = FAST_SCALED_FLOAT_TO_INT(temp, f,15);//data[i][d_offset+j],15);
            if ((unsigned int) (v + 32768) > 65535)
               v = v < 0 ? -32768 : 32767;
            *buffer++ = v;
         }
         for (   ; i < buf_c; ++i)
            *buffer++ = 0;
      }
   }
}